

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmrc.hpp
# Opt level: O0

file_or_directory * __thiscall
cmrc::embedded_filesystem::_get(embedded_filesystem *this,string *path)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_80;
  _Self local_78;
  const_iterator found;
  string local_60;
  string local_40;
  string *local_20;
  string *path_local;
  embedded_filesystem *this_local;
  
  local_20 = path;
  path_local = (string *)this;
  std::__cxx11::string::string((string *)&local_60,(string *)path);
  detail::normalize_path(&local_40,&local_60);
  std::__cxx11::string::operator=((string *)path,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  local_78._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmrc::detail::file_or_directory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmrc::detail::file_or_directory_*>_>_>
       ::find(this->_index,path);
  local_80._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmrc::detail::file_or_directory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmrc::detail::file_or_directory_*>_>_>
       ::end(this->_index);
  bVar1 = std::operator==(&local_78,&local_80);
  if (bVar1) {
    this_local = (embedded_filesystem *)0x0;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmrc::detail::file_or_directory_*>_>
             ::operator->(&local_78);
    this_local = (embedded_filesystem *)ppVar2->second;
  }
  return (file_or_directory *)this_local;
}

Assistant:

const detail::file_or_directory* _get(std::string path) const {
        path = detail::normalize_path(path);
        auto found = _index->find(path);
        if (found == _index->end()) {
            return nullptr;
        } else {
            return found->second;
        }
    }